

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O3

void __thiscall ftxui::anon_unknown_0::Border::ComputeRequirement(Border *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  undefined8 uVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  
  Node::ComputeRequirement(&this->super_Node);
  psVar3 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar5 = (psVar3->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)((long)&peVar5->requirement_ + 0x20);
  iVar12 = *(int *)((long)&peVar5->requirement_ + 0x28);
  iVar11 = (peVar5->requirement_).min_y;
  uVar8 = *(undefined8 *)((long)&peVar5->requirement_ + 8);
  uVar9 = *(undefined8 *)((long)&peVar5->requirement_ + 0x10);
  uVar10 = *(undefined8 *)((long)&peVar5->requirement_ + 0x18);
  (this->super_Node).requirement_.min_x = (peVar5->requirement_).min_x;
  (this->super_Node).requirement_.min_y = iVar11;
  *(undefined8 *)&(this->super_Node).requirement_.flex_grow_x = uVar8;
  (this->super_Node).requirement_.selected_box.y_max = iVar12;
  *(undefined8 *)&(this->super_Node).requirement_.selected_box.x_max = uVar6;
  uVar1 = (this->super_Node).requirement_.min_x;
  uVar2 = (this->super_Node).requirement_.min_y;
  iVar12 = uVar1 + 2;
  *(undefined8 *)&(this->super_Node).requirement_.flex_shrink_x = uVar9;
  *(undefined8 *)&(this->super_Node).requirement_.selection = uVar10;
  (this->super_Node).requirement_.min_x = iVar12;
  (this->super_Node).requirement_.min_y = uVar2 + 2;
  if ((long)psVar4 - (long)psVar3 == 0x20) {
    iVar11 = ((psVar3[1].super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_x + 2;
    if (iVar11 < iVar12) {
      iVar11 = iVar12;
    }
    (this->super_Node).requirement_.min_x = iVar11;
  }
  iVar12 = (this->super_Node).requirement_.selected_box.x_max;
  iVar11 = (this->super_Node).requirement_.selected_box.y_min;
  iVar7 = (this->super_Node).requirement_.selected_box.y_max;
  (this->super_Node).requirement_.selected_box.x_min =
       (this->super_Node).requirement_.selected_box.x_min + 1;
  (this->super_Node).requirement_.selected_box.x_max = iVar12 + 1;
  (this->super_Node).requirement_.selected_box.y_min = iVar11 + 1;
  (this->super_Node).requirement_.selected_box.y_max = iVar7 + 1;
  return;
}

Assistant:

void ComputeRequirement() override {
    Node::ComputeRequirement();
    requirement_ = children_[0]->requirement();
    requirement_.min_x += 2;
    requirement_.min_y += 2;
    if (children_.size() == 2) {
      requirement_.min_x =
          std::max(requirement_.min_x, children_[1]->requirement().min_x + 2);
    }
    requirement_.selected_box.x_min++;
    requirement_.selected_box.x_max++;
    requirement_.selected_box.y_min++;
    requirement_.selected_box.y_max++;
  }